

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpi_encode(MppCtx ctx,MppFrame frame,MppPacket *packet)

{
  MpiImpl *p;
  MPP_RET ret;
  MppPacket *packet_local;
  MppFrame frame_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p frame %p packet %p\n","mpi_encode",ctx,frame,packet);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpi_encode");
  if ((p._4_4_ == MPP_OK) && ((frame == (MppFrame)0x0 || (packet == (MppPacket *)0x0)))) {
    _mpp_log_l(2,"mpi","found NULL input frame %p packet %p\n","mpi_encode",frame,packet);
    p._4_4_ = MPP_ERR_NULL_PTR;
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_encode",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

static MPP_RET mpi_encode(MppCtx ctx, MppFrame frame, MppPacket *packet)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p frame %p packet %p\n", ctx, frame, packet);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;

        if (NULL == frame || NULL == packet) {
            mpp_err_f("found NULL input frame %p packet %p\n", frame, packet);
            ret = MPP_ERR_NULL_PTR;
            break;
        }

        // TODO: do encode here
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}